

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeImportInfo
          (cmGeneratorTarget *this,string *desired_config,ImportInfo *info)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> local_89;
  string linkProp;
  string local_68;
  string suffix;
  char *imp;
  char *loc;
  
  info->NoSOName = false;
  loc = (char *)0x0;
  imp = (char *)0x0;
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  suffix._M_string_length = 0;
  suffix.field_2._M_local_buf[0] = '\0';
  bVar1 = cmTarget::GetMappedConfig(this->Target,desired_config,&loc,&imp,&suffix);
  if (!bVar1) goto LAB_0015ecf7;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkProp,"INTERFACE_LINK_LIBRARIES",(allocator<char> *)&local_68);
  pcVar2 = GetProperty(this,&linkProp);
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
LAB_0015e716:
    if (pcVar2 != (char *)0x0) goto LAB_0015e75b;
  }
  else {
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::assign((char *)&linkProp);
      std::__cxx11::string::append((string *)&linkProp);
      pcVar2 = GetProperty(this,&linkProp);
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::assign((char *)&linkProp);
        pcVar2 = GetProperty(this,&linkProp);
        goto LAB_0015e716;
      }
    }
LAB_0015e75b:
    std::__cxx11::string::_M_assign((string *)&info->LibrariesProp);
    std::__cxx11::string::assign((char *)&info->Libraries);
  }
  std::__cxx11::string::~string((string *)&linkProp);
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
    if (loc != (char *)0x0) {
      std::__cxx11::string::assign((char *)&info->LibName);
    }
    goto LAB_0015ecf7;
  }
  if (loc == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkProp,"IMPORTED_LOCATION",(allocator<char> *)&local_68);
    std::__cxx11::string::append((string *)&linkProp);
    pcVar2 = GetProperty(this,&linkProp);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"IMPORTED_LOCATION",&local_89);
      pcVar2 = GetProperty(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&info->Location);
      }
    }
    else {
      std::__cxx11::string::assign((char *)&info->Location);
    }
    std::__cxx11::string::~string((string *)&linkProp);
  }
  else {
    std::__cxx11::string::assign((char *)&info->Location);
  }
  if (this->Target->TargetTypeValue == SHARED_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkProp,"IMPORTED_SONAME",(allocator<char> *)&local_68);
    std::__cxx11::string::append((string *)&linkProp);
    pcVar2 = GetProperty(this,&linkProp);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"IMPORTED_SONAME",&local_89);
      pcVar2 = GetProperty(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&info->SOName);
      }
    }
    else {
      std::__cxx11::string::assign((char *)&info->SOName);
    }
    std::__cxx11::string::~string((string *)&linkProp);
    if (this->Target->TargetTypeValue == SHARED_LIBRARY) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkProp,"IMPORTED_NO_SONAME",(allocator<char> *)&local_68);
      std::__cxx11::string::append((string *)&linkProp);
      pcVar2 = GetProperty(this,&linkProp);
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"IMPORTED_NO_SONAME",&local_89);
        pcVar2 = GetProperty(this,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if (pcVar2 != (char *)0x0) {
          bVar1 = cmSystemTools::IsOn(pcVar2);
          goto LAB_0015e9a7;
        }
      }
      else {
        bVar1 = cmSystemTools::IsOn(pcVar2);
LAB_0015e9a7:
        info->NoSOName = bVar1;
      }
      std::__cxx11::string::~string((string *)&linkProp);
    }
  }
  if (imp == (char *)0x0) {
    if ((this->Target->TargetTypeValue == SHARED_LIBRARY) ||
       (bVar1 = IsExecutableWithExports(this), bVar1)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&linkProp,"IMPORTED_IMPLIB",(allocator<char> *)&local_68);
      std::__cxx11::string::append((string *)&linkProp);
      pcVar2 = GetProperty(this,&linkProp);
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"IMPORTED_IMPLIB",&local_89);
        pcVar2 = GetProperty(this,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        if (pcVar2 != (char *)0x0) {
          std::__cxx11::string::assign((char *)&info->ImportLibrary);
        }
      }
      else {
        std::__cxx11::string::assign((char *)&info->ImportLibrary);
      }
      std::__cxx11::string::~string((string *)&linkProp);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&info->ImportLibrary);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkProp,"IMPORTED_LINK_DEPENDENT_LIBRARIES",(allocator<char> *)&local_68);
  std::__cxx11::string::append((string *)&linkProp);
  pcVar2 = GetProperty(this,&linkProp);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"IMPORTED_LINK_DEPENDENT_LIBRARIES",&local_89);
    pcVar2 = GetProperty(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::assign((char *)&info->SharedDeps);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&info->SharedDeps);
  }
  std::__cxx11::string::~string((string *)&linkProp);
  if (this->Target->TargetTypeValue == STATIC_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkProp,"IMPORTED_LINK_INTERFACE_LANGUAGES",(allocator<char> *)&local_68)
    ;
    std::__cxx11::string::append((string *)&linkProp);
    pcVar2 = GetProperty(this,&linkProp);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"IMPORTED_LINK_INTERFACE_LANGUAGES",&local_89);
      pcVar2 = GetProperty(this,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::assign((char *)&info->Languages);
      }
    }
    else {
      std::__cxx11::string::assign((char *)&info->Languages);
    }
    std::__cxx11::string::~string((string *)&linkProp);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkProp,"IMPORTED_COMMON_LANGUAGE_RUNTIME",(allocator<char> *)&local_68);
  std::operator+(&local_68,&linkProp,&suffix);
  pcVar2 = GetProperty(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = GetProperty(this,&linkProp);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar2,&local_89);
      goto LAB_0015ec34;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar2,&local_89);
LAB_0015ec34:
    info->Managed = Managed - (local_68._M_string_length == 0);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)&linkProp);
  if (this->Target->TargetTypeValue != STATIC_LIBRARY) goto LAB_0015ecf7;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkProp,"IMPORTED_LINK_INTERFACE_MULTIPLICITY",(allocator<char> *)&local_68
            );
  std::__cxx11::string::append((string *)&linkProp);
  pcVar2 = GetProperty(this,&linkProp);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"IMPORTED_LINK_INTERFACE_MULTIPLICITY",&local_89);
    pcVar2 = GetProperty(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (pcVar2 != (char *)0x0) goto LAB_0015ecd5;
  }
  else {
LAB_0015ecd5:
    __isoc99_sscanf(pcVar2,"%u",&info->Multiplicity);
  }
  std::__cxx11::string::~string((string *)&linkProp);
LAB_0015ecf7:
  std::__cxx11::string::~string((string *)&suffix);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeImportInfo(std::string const& desired_config,
                                          ImportInfo& info) const
{
  // This method finds information about an imported target from its
  // properties.  The "IMPORTED_" namespace is reserved for properties
  // defined by the project exporting the target.

  // Initialize members.
  info.NoSOName = false;

  const char* loc = nullptr;
  const char* imp = nullptr;
  std::string suffix;
  if (!this->Target->GetMappedConfig(desired_config, &loc, &imp, suffix)) {
    return;
  }

  // Get the link interface.
  {
    std::string linkProp = "INTERFACE_LINK_LIBRARIES";
    const char* propertyLibs = this->GetProperty(linkProp);

    if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
      if (!propertyLibs) {
        linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
        linkProp += suffix;
        propertyLibs = this->GetProperty(linkProp);
      }

      if (!propertyLibs) {
        linkProp = "IMPORTED_LINK_INTERFACE_LIBRARIES";
        propertyLibs = this->GetProperty(linkProp);
      }
    }
    if (propertyLibs) {
      info.LibrariesProp = linkProp;
      info.Libraries = propertyLibs;
    }
  }
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    if (loc) {
      info.LibName = loc;
    }
    return;
  }

  // A provided configuration has been chosen.  Load the
  // configuration's properties.

  // Get the location.
  if (loc) {
    info.Location = loc;
  } else {
    std::string impProp = "IMPORTED_LOCATION";
    impProp += suffix;
    if (const char* config_location = this->GetProperty(impProp)) {
      info.Location = config_location;
    } else if (const char* location = this->GetProperty("IMPORTED_LOCATION")) {
      info.Location = location;
    }
  }

  // Get the soname.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string soProp = "IMPORTED_SONAME";
    soProp += suffix;
    if (const char* config_soname = this->GetProperty(soProp)) {
      info.SOName = config_soname;
    } else if (const char* soname = this->GetProperty("IMPORTED_SONAME")) {
      info.SOName = soname;
    }
  }

  // Get the "no-soname" mark.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string soProp = "IMPORTED_NO_SONAME";
    soProp += suffix;
    if (const char* config_no_soname = this->GetProperty(soProp)) {
      info.NoSOName = cmSystemTools::IsOn(config_no_soname);
    } else if (const char* no_soname =
                 this->GetProperty("IMPORTED_NO_SONAME")) {
      info.NoSOName = cmSystemTools::IsOn(no_soname);
    }
  }

  // Get the import library.
  if (imp) {
    info.ImportLibrary = imp;
  } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
             this->IsExecutableWithExports()) {
    std::string impProp = "IMPORTED_IMPLIB";
    impProp += suffix;
    if (const char* config_implib = this->GetProperty(impProp)) {
      info.ImportLibrary = config_implib;
    } else if (const char* implib = this->GetProperty("IMPORTED_IMPLIB")) {
      info.ImportLibrary = implib;
    }
  }

  // Get the link dependencies.
  {
    std::string linkProp = "IMPORTED_LINK_DEPENDENT_LIBRARIES";
    linkProp += suffix;
    if (const char* config_libs = this->GetProperty(linkProp)) {
      info.SharedDeps = config_libs;
    } else if (const char* libs =
                 this->GetProperty("IMPORTED_LINK_DEPENDENT_LIBRARIES")) {
      info.SharedDeps = libs;
    }
  }

  // Get the link languages.
  if (this->LinkLanguagePropagatesToDependents()) {
    std::string linkProp = "IMPORTED_LINK_INTERFACE_LANGUAGES";
    linkProp += suffix;
    if (const char* config_libs = this->GetProperty(linkProp)) {
      info.Languages = config_libs;
    } else if (const char* libs =
                 this->GetProperty("IMPORTED_LINK_INTERFACE_LANGUAGES")) {
      info.Languages = libs;
    }
  }

  // Get information if target is managed assembly.
  {
    std::string linkProp = "IMPORTED_COMMON_LANGUAGE_RUNTIME";
    if (auto pc = this->GetProperty(linkProp + suffix)) {
      info.Managed = this->CheckManagedType(pc);
    } else if (auto p = this->GetProperty(linkProp)) {
      info.Managed = this->CheckManagedType(p);
    }
  }

  // Get the cyclic repetition count.
  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    std::string linkProp = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
    linkProp += suffix;
    if (const char* config_reps = this->GetProperty(linkProp)) {
      sscanf(config_reps, "%u", &info.Multiplicity);
    } else if (const char* reps =
                 this->GetProperty("IMPORTED_LINK_INTERFACE_MULTIPLICITY")) {
      sscanf(reps, "%u", &info.Multiplicity);
    }
  }
}